

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCall
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Instruction *Inst)

{
  Value *calledValue;
  raw_ostream *prVar1;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  ValInfo local_48;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_40;
  
  calledValue = (Value *)llvm::Value::stripPointerCasts();
  if (*(char *)(*(long *)(Inst + -0x20) + 0x10) == '\x17') {
    if (createCall(llvm::Instruction_const*)::warned_inline_assembly == '\0') {
      prVar1 = (raw_ostream *)llvm::errs();
      Str.Length = 0x26;
      Str.Data = "[RWG] WARNING: Inline assembler found\n";
      llvm::raw_ostream::operator<<(prVar1,Str);
      createCall(llvm::Instruction_const*)::warned_inline_assembly = '\x01';
    }
    local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)createUnknownCall(this,(CallInst *)Inst);
    (__return_storage_ptr__->nodes).
    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nodes).
    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->representant = (RWNode *)0x0;
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    _M_range_insert<dg::dda::RWNode*const*>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)__return_storage_ptr__,0
               ,&local_40);
    __return_storage_ptr__->representant =
         (RWNode *)
         local_40.
         super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl
         .super__Vector_impl_data._M_start;
  }
  else {
    if ((calledValue == (Value *)0x0) || (calledValue[0x10] != (Value)0x0)) {
      getCalledFunctions(&local_40,calledValue,this->PTA);
      if (local_40.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_40.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        prVar1 = (raw_ostream *)llvm::errs();
        Str_00.Length = 0x4d;
        Str_00.Data = 
        "[RWG] error: could not determine the called function in a call via pointer: \n";
        prVar1 = llvm::raw_ostream::operator<<(prVar1,Str_00);
        local_48.v = (Value *)Inst;
        prVar1 = operator<<(prVar1,&local_48);
        Str_01.Length = 1;
        Str_01.Data = "\n";
        llvm::raw_ostream::operator<<(prVar1,Str_01);
        local_48.v = (Value *)createUnknownCall(this,(CallInst *)Inst);
        (__return_storage_ptr__->nodes).
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->nodes).
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->nodes).
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __return_storage_ptr__->representant = (RWNode *)0x0;
        std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
        _M_range_insert<dg::dda::RWNode*const*>
                  ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)
                   __return_storage_ptr__,0,&local_48,&local_40);
        __return_storage_ptr__->representant = (RWNode *)local_48.v;
      }
      else {
        createCallToFunctions(__return_storage_ptr__,this,&local_40,(CallInst *)Inst);
      }
    }
    else {
      local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
      local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_40.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      *local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Function *)calledValue;
      local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_40.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      createCallToFunctions(__return_storage_ptr__,this,&local_40,(CallInst *)Inst);
    }
    if (local_40.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodesSeq<RWNode>
LLVMReadWriteGraphBuilder::createCall(const llvm::Instruction *Inst) {
    using namespace llvm;
    const CallInst *CInst = cast<CallInst>(Inst);
#if LLVM_VERSION_MAJOR >= 8
    const Value *calledVal = CInst->getCalledOperand()->stripPointerCasts();
#else
    const Value *calledVal = CInst->getCalledValue()->stripPointerCasts();
#endif
    static bool warned_inline_assembly = false;

    if (CInst->isInlineAsm()) {
        if (!warned_inline_assembly) {
            llvm::errs() << "[RWG] WARNING: Inline assembler found\n";
            warned_inline_assembly = true;
        }
        return {createUnknownCall(CInst)};
    }

    if (const Function *function = dyn_cast<Function>(calledVal)) {
        return createCallToFunctions({function}, CInst);
    }

    const auto &functions = getCalledFunctions(calledVal, PTA);
    if (functions.empty()) {
        llvm::errs() << "[RWG] error: could not determine the called function "
                        "in a call via pointer: \n"
                     << ValInfo(CInst) << "\n";
        return {createUnknownCall(CInst)};
    }
    return createCallToFunctions(functions, CInst);
}